

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.h
# Opt level: O3

Name __thiscall CFG::RelooperBuilder::getBlockBreakName(RelooperBuilder *this,int id)

{
  size_type *psVar1;
  IString *this_00;
  uint uVar2;
  undefined8 *puVar3;
  long *plVar4;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  pointer pcVar9;
  uint __val;
  uint __len;
  string_view sVar10;
  long local_a0;
  long lStack_98;
  pointer *local_90;
  long local_88;
  pointer local_80 [2];
  size_type *local_70;
  string __str;
  long local_40;
  undefined8 uStack_38;
  
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"block$","");
  __val = -id;
  if (0 < id) {
    __val = id;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00764159;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00764159;
      }
      if (uVar5 < 10000) goto LAB_00764159;
      uVar7 = uVar7 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_00764159:
  psVar1 = &__str._M_string_length;
  local_70 = psVar1;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)(id >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)id >> 0x1f) + (long)local_70),__len,__val);
  pcVar9 = (pointer)0xf;
  if (local_90 != local_80) {
    pcVar9 = local_80[0];
  }
  if (pcVar9 < __str._M_dataplus._M_p + local_88) {
    pcVar9 = (pointer)0xf;
    if (local_70 != psVar1) {
      pcVar9 = (pointer)__str._M_string_length;
    }
    if (__str._M_dataplus._M_p + local_88 <= pcVar9) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_007641df;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_007641df:
  __str.field_2._8_8_ = &local_40;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_40 = *plVar4;
    uStack_38 = puVar3[3];
  }
  else {
    local_40 = *plVar4;
    __str.field_2._8_8_ = (long *)*puVar3;
  }
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar4[3];
    plVar8 = &local_a0;
  }
  else {
    local_a0 = *plVar6;
    plVar8 = (long *)*plVar4;
  }
  this_00 = (IString *)plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  sVar10._M_str = (char *)0x0;
  sVar10._M_len = (size_t)plVar8;
  sVar10 = ::wasm::IString::interned(this_00,sVar10,SUB81(plVar6,0));
  if (plVar8 != &local_a0) {
    operator_delete(plVar8,local_a0 + 1);
  }
  if ((long *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
  }
  if (local_70 != psVar1) {
    operator_delete(local_70,__str._M_string_length + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,(ulong)(local_80[0] + 1));
  }
  return (IString)(IString)sVar10;
}

Assistant:

wasm::Name getBlockBreakName(int id) {
    return wasm::Name(std::string("block$") + std::to_string(id) + "$break");
  }